

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# push_test.cc
# Opt level: O0

int main(void)

{
  test_batch_get_devices_info();
  test_push_byte_message();
  test_revert_rpc();
  return 0;
}

Assistant:

int main() {
  test_batch_get_devices_info();
  test_push_byte_message();
  test_revert_rpc();
}